

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

void __thiscall
Matrix3f::Matrix3f(Matrix3f *this,float m00,float m01,float m02,float m10,float m11,float m12,
                  float m20,float m21,float m22)

{
  this->m_elements[0] = m00;
  this->m_elements[1] = m10;
  this->m_elements[2] = m20;
  this->m_elements[3] = m01;
  this->m_elements[4] = m11;
  this->m_elements[5] = m21;
  this->m_elements[6] = m02;
  this->m_elements[7] = m12;
  this->m_elements[8] = m22;
  return;
}

Assistant:

Matrix3f::Matrix3f( float m00, float m01, float m02,
				   float m10, float m11, float m12,
				   float m20, float m21, float m22 )
{
	m_elements[ 0 ] = m00;
	m_elements[ 1 ] = m10;
	m_elements[ 2 ] = m20;

	m_elements[ 3 ] = m01;
	m_elements[ 4 ] = m11;
	m_elements[ 5 ] = m21;

	m_elements[ 6 ] = m02;
	m_elements[ 7 ] = m12;
	m_elements[ 8 ] = m22;
}